

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  int overflow;
  secp256k1_fe rx;
  uchar buf [32];
  secp256k1_scalar s;
  secp256k1_ge r;
  secp256k1_scalar e;
  secp256k1_ge pk;
  secp256k1_gej pkj;
  secp256k1_gej rj;
  int local_2ac;
  secp256k1_fe local_2a8;
  uchar local_278 [32];
  secp256k1_scalar local_258;
  secp256k1_ge local_238;
  secp256k1_scalar local_1d8;
  secp256k1_fe local_1b8;
  secp256k1_ge local_190;
  undefined1 local_138 [104];
  undefined1 local_d0 [16];
  int local_c0;
  secp256k1_gej local_b0;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_schnorrsig_verify_cold_4();
  }
  else if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_verify_cold_3();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_schnorrsig_verify_cold_2();
  }
  else {
    if (pubkey != (secp256k1_xonly_pubkey *)0x0) {
      iVar1 = secp256k1_fe_set_b32(&local_2a8,sig64);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_258,sig64 + 0x20,&local_2ac);
      if (local_2ac != 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&local_190,(secp256k1_pubkey *)pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_fe_get_b32(local_278,&local_190.x);
      secp256k1_schnorrsig_challenge(&local_1d8,sig64,msg32,local_278);
      secp256k1_scalar_negate(&local_1d8,&local_1d8);
      local_c0 = local_190.infinity;
      local_138._0_8_ = local_190.x.n[0];
      local_138._8_8_ = local_190.x.n[1];
      local_138._16_8_ = local_190.x.n[2];
      local_138._24_8_ = local_190.x.n[3];
      local_138._32_8_ = local_190.x.n[4];
      local_138._40_8_ = local_190.y.n[0];
      local_138._48_8_ = local_190.y.n[1];
      local_138._56_8_ = local_190.y.n[2];
      local_138._64_8_ = local_190.y.n[3];
      local_138._72_8_ = local_190.y.n[4];
      local_138._80_8_ = 1;
      local_138._88_16_ = (undefined1  [16])0x0;
      local_d0 = (undefined1  [16])0x0;
      secp256k1_ecmult(&ctx->ecmult_ctx,&local_b0,(secp256k1_gej *)local_138,&local_1d8,&local_258);
      secp256k1_ge_set_gej_var(&local_238,&local_b0);
      if (local_238.infinity != 0) {
        return 0;
      }
      secp256k1_fe_normalize_var(&local_238.y);
      if (((byte)local_238.y.n[0] & 1) != 0) {
        return 0;
      }
      local_1b8.n[0] = (local_238.x.n[0] - local_2a8.n[0]) + 0x3ffffbfffff0bc;
      local_1b8.n[1] = (local_238.x.n[1] - local_2a8.n[1]) + 0x3ffffffffffffc;
      local_1b8.n[2] = (local_238.x.n[2] - local_2a8.n[2]) + 0x3ffffffffffffc;
      local_1b8.n[3] = (local_238.x.n[3] - local_2a8.n[3]) + 0x3ffffffffffffc;
      local_1b8.n[4] = (local_238.x.n[4] - local_2a8.n[4]) + 0x3fffffffffffc;
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&local_1b8);
      return iVar1;
    }
    secp256k1_schnorrsig_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg32, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg32, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&ctx->ecmult_ctx, &rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal_var(&rx, &r.x);
}